

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O1

int __thiscall OpenMD::Shake::constraintPairR(Shake *this,ConstraintPair *consPair)

{
  double *pdVar1;
  ConstraintElem *pCVar2;
  ConstraintElem *pCVar3;
  StuntDouble *pSVar4;
  StuntDouble *pSVar5;
  double dVar6;
  uint i;
  int iVar7;
  long lVar8;
  uint i_7;
  uint i_4;
  double tmp;
  double dVar9;
  double dVar10;
  double tmp_1;
  double dVar11;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result;
  Vector<double,_3U> result_2;
  double local_128 [4];
  double local_108 [4];
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [4];
  double local_88;
  undefined8 uStack_80;
  Vector3d local_78;
  double local_58 [4];
  Vector3d local_38;
  
  pCVar2 = consPair->consElem1_;
  pCVar3 = consPair->consElem2_;
  pSVar4 = pCVar2->sd_;
  lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data + pSVar4->storage_);
  local_c8[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar8 + (long)pSVar4->localIndex_ * 0x18);
  local_c8[0] = *pdVar1;
  local_c8[1] = pdVar1[1];
  pSVar4 = pCVar3->sd_;
  lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
  local_e8[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar8 + (long)pSVar4->localIndex_ * 0x18);
  local_e8[0] = *pdVar1;
  local_e8[1] = pdVar1[1];
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_108[2] = 0.0;
  lVar8 = 0;
  do {
    local_108[lVar8] = local_c8[lVar8] - local_e8[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_38.super_Vector<double,_3U>.data_[2] = local_108[2];
  local_38.super_Vector<double,_3U>.data_[0] = local_108[0];
  local_38.super_Vector<double,_3U>.data_[1] = local_108[1];
  Snapshot::wrapVector(this->currentSnapshot_,&local_38);
  local_88 = 0.0;
  lVar8 = 0;
  do {
    dVar9 = local_38.super_Vector<double,_3U>.data_[lVar8];
    local_88 = local_88 + dVar9 * dVar9;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_c8[3] = consPair->dist2;
  local_88 = local_c8[3] - local_88;
  dVar9 = this->consTolerance_ * local_c8[3];
  iVar7 = 1;
  if (dVar9 + dVar9 < ABS(local_88)) {
    uStack_80 = 0;
    pSVar4 = pCVar2->sd_;
    lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->previousSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data + pSVar4->storage_);
    local_108[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar8 + (long)pSVar4->localIndex_ * 0x18);
    local_108[0] = *pdVar1;
    local_108[1] = pdVar1[1];
    pSVar4 = pCVar3->sd_;
    lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->previousSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
    local_58[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar8 + (long)pSVar4->localIndex_ * 0x18);
    local_58[0] = *pdVar1;
    local_58[1] = pdVar1[1];
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    local_128[2] = 0.0;
    lVar8 = 0;
    do {
      local_128[lVar8] = local_108[lVar8] - local_58[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    local_78.super_Vector<double,_3U>.data_[2] = local_128[2];
    local_78.super_Vector<double,_3U>.data_[0] = local_128[0];
    local_78.super_Vector<double,_3U>.data_[1] = local_128[1];
    Snapshot::wrapVector(this->currentSnapshot_,&local_78);
    dVar9 = 0.0;
    lVar8 = 0;
    do {
      dVar9 = dVar9 + local_78.super_Vector<double,_3U>.data_[lVar8] *
                      local_38.super_Vector<double,_3U>.data_[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    iVar7 = -1;
    if (local_c8[3] * -local_88 <= dVar9 * dVar9) {
      pSVar4 = pCVar2->sd_;
      dVar10 = 1.0 / pSVar4->mass_;
      pSVar5 = pCVar3->sd_;
      dVar6 = 1.0 / pSVar5->mass_;
      dVar11 = dVar10 + dVar6;
      local_88 = local_88 / (dVar9 * (dVar11 + dVar11));
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      lVar8 = 0;
      do {
        local_a8[lVar8] = local_78.super_Vector<double,_3U>.data_[lVar8] * local_88;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      lVar8 = 0;
      do {
        local_128[lVar8] = local_a8[lVar8] * dVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_c8[lVar8] = local_128[lVar8] + local_c8[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      iVar7 = pSVar4->localIndex_;
      lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data + pSVar4->storage_);
      *(double *)(lVar8 + 0x10 + (long)iVar7 * 0x18) = local_c8[2];
      pdVar1 = (double *)(lVar8 + (long)iVar7 * 0x18);
      *pdVar1 = local_c8[0];
      pdVar1[1] = local_c8[1];
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      lVar8 = 0;
      do {
        local_128[lVar8] = local_a8[lVar8] * dVar6;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_e8[lVar8] = local_e8[lVar8] - local_128[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      iVar7 = pSVar5->localIndex_;
      lVar8 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
      *(double *)(lVar8 + 0x10 + (long)iVar7 * 0x18) = local_e8[2];
      pdVar1 = (double *)(lVar8 + (long)iVar7 * 0x18);
      *pdVar1 = local_e8[0];
      pdVar1[1] = local_e8[1];
      consPair->force_ = local_88;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int Shake::constraintPairR(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d pab = posA - posB;

    // periodic boundary condition

    currentSnapshot_->wrapVector(pab);

    RealType pabsq = pab.lengthSquare();

    RealType rabsq  = consPair->getConsDistSquare();
    RealType diffsq = rabsq - pabsq;

    // the original rattle code from alan tidesley
    if (fabs(diffsq) > (consTolerance_ * rabsq * 2)) {
      Vector3d oldPosA = consElem1->getPrevPos();
      Vector3d oldPosB = consElem2->getPrevPos();

      Vector3d rab = oldPosA - oldPosB;

      currentSnapshot_->wrapVector(rab);

      RealType rpab   = dot(rab, pab);
      RealType rpabsq = rpab * rpab;

      if (rpabsq < (rabsq * -diffsq)) { return consFail; }

      RealType rma = 1.0 / consElem1->getMass();
      RealType rmb = 1.0 / consElem2->getMass();

      RealType gab = diffsq / (2.0 * (rma + rmb) * rpab);

      Vector3d delta = rab * gab;

      // set atom1's position
      posA += rma * delta;
      consElem1->setPos(posA);

      // set atom2's position
      posB -= rmb * delta;
      consElem2->setPos(posB);

      // report the constraint force back to the constraint pair:
      consPair->setConstraintForce(gab);
      return consSuccess;
    } else
      return consAlready;
  }